

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_refpass_raw(opj_t1_t *t1,int bpno,int cblksty)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  flag_t *in_RDI;
  opj_t1_t *unaff_retaddr;
  int vsc;
  int neghalf;
  int poshalf;
  int one;
  int k;
  int j;
  int i;
  int vsc_00;
  int neghalf_00;
  int poshalf_00;
  
  for (vsc_00 = 0; vsc_00 < *(int *)(in_RDI + 0x16); vsc_00 = vsc_00 + 4) {
    for (poshalf_00 = 0; neghalf_00 = vsc_00, poshalf_00 < *(int *)(in_RDI + 0x14);
        poshalf_00 = poshalf_00 + 1) {
      while( true ) {
        bVar1 = false;
        if (neghalf_00 < vsc_00 + 4) {
          bVar1 = neghalf_00 < *(int *)(in_RDI + 0x16);
        }
        if (!bVar1) break;
        t1_dec_refpass_step_raw
                  (unaff_retaddr,in_RDI,(int *)CONCAT44(in_ESI,in_EDX),poshalf_00,neghalf_00,vsc_00)
        ;
        neghalf_00 = neghalf_00 + 1;
      }
    }
  }
  return;
}

Assistant:

static void t1_dec_refpass_raw(
		opj_t1_t *t1,
		int bpno,
		int cblksty)
{
	int i, j, k, one, poshalf, neghalf;
	int vsc;
	one = 1 << bpno;
	poshalf = one >> 1;
	neghalf = bpno > 0 ? -poshalf : -1;
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			for (j = k; j < k + 4 && j < t1->h; ++j) {
				vsc = ((cblksty & J2K_CCP_CBLKSTY_VSC) && (j == k + 3 || j == t1->h - 1)) ? 1 : 0;
				t1_dec_refpass_step_raw(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						poshalf,
						neghalf,
						vsc);
			}
		}
	}
}